

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

undefined4 __thiscall
despot::RockSampleEastBeliefPolicy::Value(RockSampleEastBeliefPolicy *this,Belief *belief)

{
  int iVar1;
  BaseRockSample *this_00;
  uint uVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_01;
  const_reference ppSVar3;
  double dVar4;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  Belief *belief_local;
  RockSampleEastBeliefPolicy *this_local;
  
  this_01 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)belief + 0x30))();
  this_00 = this->rs_model_;
  iVar1 = this_00->size_;
  ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[](this_01,0);
  uVar2 = BaseRockSample::GetX(this_00,*ppSVar3);
  dVar4 = Globals::Discount(~uVar2 + iVar1);
  despot::ValuedAction::ValuedAction((ValuedAction *)&this_local,1,dVar4 * 10.0);
  return this_local._0_4_;
}

Assistant:

ValuedAction Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();
		return ValuedAction(Compass::EAST,
			Globals::Discount(rs_model_->size_ - rs_model_->GetX(particles[0]) - 1) * 10);
	}